

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManMappingVerify(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_2c;
  int local_24;
  int Result;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    Gia_ManIncrementTravId(p);
    iVar1 = Gia_ManBufNum(p);
    if (iVar1 == 0) {
      local_2c = p->nObjs;
    }
    else {
      local_2c = 0;
    }
    local_24 = local_2c;
    while( true ) {
      bVar4 = false;
      if (local_24 < p->nObjs) {
        pFanin = Gia_ManObj(p,local_24);
        bVar4 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsBuf(pFanin);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(pFanin);
        iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjId(p,pGVar3);
          iVar1 = Gia_ObjIsLut(p,iVar1);
          if (iVar1 == 0) {
            uVar2 = Gia_ObjId(p,pGVar3);
            Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n",(ulong)uVar2)
            ;
          }
          else {
            Gia_ManMappingVerify_rec(p,pGVar3);
          }
        }
      }
      local_24 = local_24 + 1;
    }
    local_24 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar4 = false;
      if (local_24 < iVar1) {
        pFanin = Gia_ManCo(p,local_24);
        bVar4 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pGVar3 = Gia_ObjFanin0(pFanin);
      iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjId(p,pGVar3);
        iVar1 = Gia_ObjIsLut(p,iVar1);
        if (iVar1 == 0) {
          uVar2 = Gia_ObjId(p,pGVar3);
          Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n",(ulong)uVar2);
        }
        else {
          Gia_ManMappingVerify_rec(p,pGVar3);
        }
      }
      local_24 = local_24 + 1;
    }
    return;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                ,0x7f7,"void Gia_ManMappingVerify(Gia_Man_t *)");
}

Assistant:

void Gia_ManMappingVerify( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, Result = 1;
    assert( Gia_ManHasMapping(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachBuf( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
//    if ( Result && Gia_NtkIsRoot(p) )
//        Abc_Print( 1, "Mapping verified correctly.\n" );
}